

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaPf.c
# Opt level: O3

void Pf_StoCreateGate(Pf_Man_t *pMan,Mio_Cell_t *pCell,int **pComp,int **pPerm,int *pnPerms)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  byte bVar4;
  ulong uVar5;
  ulong uTruth;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int Perm [6];
  uint local_68 [6];
  ulong local_50;
  int **local_48;
  ulong local_40;
  int **local_38;
  
  uVar1 = *(uint *)&pCell->field_0x8;
  uVar7 = uVar1 >> 0x1c;
  uVar2 = pnPerms[uVar7];
  local_48 = pPerm;
  local_38 = pComp;
  if (0xfffffff < uVar1) {
    lVar8 = (ulong)uVar7 - 1;
    auVar9._8_4_ = (int)lVar8;
    auVar9._0_8_ = lVar8;
    auVar9._12_4_ = (int)((ulong)lVar8 >> 0x20);
    uVar5 = 0;
    auVar9 = auVar9 ^ _DAT_007ee2e0;
    auVar10 = _DAT_007ee2d0;
    do {
      auVar11 = auVar10 ^ _DAT_007ee2e0;
      if ((bool)(~(auVar11._4_4_ == auVar9._4_4_ && auVar9._0_4_ < auVar11._0_4_ ||
                  auVar9._4_4_ < auVar11._4_4_) & 1)) {
        *(int *)((long)local_68 + uVar5 * 2) = (int)uVar5;
      }
      if ((auVar11._12_4_ != auVar9._12_4_ || auVar11._8_4_ <= auVar9._8_4_) &&
          auVar11._12_4_ <= auVar9._12_4_) {
        *(int *)((long)local_68 + uVar5 * 2 + 4) = (int)uVar5 + 2;
      }
      lVar8 = auVar10._8_8_;
      auVar10._0_8_ = auVar10._0_8_ + 2;
      auVar10._8_8_ = lVar8 + 2;
      uVar5 = uVar5 + 4;
    } while ((uVar7 * 2 + 2 & 0xfffffffc) != uVar5);
  }
  if (0 < (int)uVar2) {
    uVar5 = pCell->uTruth;
    uVar6 = 0;
    uVar7 = uVar1;
    local_50 = uVar5;
    do {
      lVar8 = 0;
      uTruth = uVar5;
      local_40 = uVar6;
      do {
        Pf_StoCreateGateAdd(pMan,uTruth,(int *)local_68,uVar7 >> 0x1c,uVar7 & 0xfffffff);
        uVar7 = *(uint *)&pCell->field_0x8;
        iVar3 = local_38[uVar7 >> 0x1c][lVar8];
        if ((int)local_68[iVar3] < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                        ,0x10e,"int Abc_LitNot(int)");
        }
        bVar4 = (byte)(1 << ((byte)iVar3 & 0x1f));
        uTruth = uTruth << (bVar4 & 0x3f) & s_Truths6[iVar3] |
                 (s_Truths6[iVar3] & uTruth) >> (bVar4 & 0x3f);
        local_68[iVar3] = local_68[iVar3] ^ 1;
        uVar6 = local_40;
        lVar8 = lVar8 + 1;
      } while ((uint)lVar8 >> (byte)(uVar1 >> 0x1c) == 0);
      if (uVar5 != uTruth) {
        __assert_fail("tTemp2 == tCur",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaPf.c"
                      ,0xc3,"void Pf_StoCreateGate(Pf_Man_t *, Mio_Cell_t *, int **, int **, int *)"
                     );
      }
      iVar3 = local_48[uVar7 >> 0x1c][local_40];
      bVar4 = (byte)(1L << ((byte)iVar3 & 0x3f));
      uVar5 = (uVar5 & s_PMasks[iVar3][2]) >> (bVar4 & 0x3f) |
              (s_PMasks[iVar3][1] & uVar5) << (bVar4 & 0x3f) | s_PMasks[iVar3][0] & uVar5;
      *(ulong *)(local_68 + iVar3) =
           CONCAT44((int)*(undefined8 *)(local_68 + iVar3),
                    (int)((ulong)*(undefined8 *)(local_68 + iVar3) >> 0x20));
      uVar6 = uVar6 + 1;
    } while (uVar6 != uVar2);
    if (local_50 != uVar5) {
      __assert_fail("tTemp1 == tCur",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaPf.c"
                    ,0xca,"void Pf_StoCreateGate(Pf_Man_t *, Mio_Cell_t *, int **, int **, int *)");
    }
  }
  return;
}

Assistant:

void Pf_StoCreateGate( Pf_Man_t * pMan, Mio_Cell_t * pCell, int ** pComp, int ** pPerm, int * pnPerms )
{
    int Perm[PF_LEAF_MAX], * Perm1, * Perm2;
    int nPerms = pnPerms[pCell->nFanins];
    int nMints = (1 << pCell->nFanins);
    word tCur, tTemp1, tTemp2;
    int i, p, c;
    for ( i = 0; i < (int)pCell->nFanins; i++ )
        Perm[i] = Abc_Var2Lit( i, 0 );
    tCur = tTemp1 = pCell->uTruth;
    for ( p = 0; p < nPerms; p++ )
    {
        tTemp2 = tCur;
        for ( c = 0; c < nMints; c++ )
        {
            Pf_StoCreateGateAdd( pMan, tCur, Perm, pCell->nFanins, pCell->Id );
            // update
            tCur  = Abc_Tt6Flip( tCur, pComp[pCell->nFanins][c] );
            Perm1 = Perm + pComp[pCell->nFanins][c];
            *Perm1 = Abc_LitNot( *Perm1 );
        }
        assert( tTemp2 == tCur );
        // update
        tCur = Abc_Tt6SwapAdjacent( tCur, pPerm[pCell->nFanins][p] );
        Perm1 = Perm + pPerm[pCell->nFanins][p];
        Perm2 = Perm1 + 1;
        ABC_SWAP( int, *Perm1, *Perm2 );
    }
    assert( tTemp1 == tCur );
}